

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O1

TagState * __thiscall
despot::MemoryPool<despot::TagState>::Allocate(MemoryPool<despot::TagState> *this)

{
  pointer ppTVar1;
  TagState *pTVar2;
  
  if ((this->freelist_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->freelist_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    NewChunk(this);
  }
  ppTVar1 = (this->freelist_).
            super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pTVar2 = ppTVar1[-1];
  (this->freelist_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppTVar1 + -1;
  if (pTVar2->field_0x8 != '\x01') {
    pTVar2->field_0x8 = 1;
    this->num_allocated_ = this->num_allocated_ + 1;
    return pTVar2;
  }
  __assert_fail("!obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x34,"T *despot::MemoryPool<despot::TagState>::Allocate() [T = despot::TagState]");
}

Assistant:

T* Allocate() {
		if (freelist_.empty())
			NewChunk();
		T* obj = freelist_.back();
		freelist_.pop_back();
		assert(!obj->IsAllocated());
		obj->SetAllocated();
		num_allocated_++;
		return obj;
	}